

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O1

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  code *pcVar1;
  ulong uVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  sockaddr local_48;
  code *local_38;
  undefined8 local_30;
  
  uVar2 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x30))
                    ((long *)CONCAT44(in_register_00000034,__fd));
  if ((uVar2 & 2) == 0) {
    local_48.sa_family = 0;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    local_38 = (code *)0x0;
    local_30 = *(undefined8 *)(__addr[1].sa_data + 6);
    pcVar1 = *(code **)(__addr + 1);
    if (pcVar1 != (code *)0x0) {
      local_48.sa_family = __addr->sa_family;
      local_48.sa_data[0] = __addr->sa_data[0];
      local_48.sa_data[1] = __addr->sa_data[1];
      local_48.sa_data[2] = __addr->sa_data[2];
      local_48.sa_data[3] = __addr->sa_data[3];
      local_48.sa_data[4] = __addr->sa_data[4];
      local_48.sa_data[5] = __addr->sa_data[5];
      local_48.sa_data._6_8_ = *(undefined8 *)(__addr->sa_data + 6);
      __addr[1].sa_family = 0;
      __addr[1].sa_data[0] = '\0';
      __addr[1].sa_data[1] = '\0';
      __addr[1].sa_data[2] = '\0';
      __addr[1].sa_data[3] = '\0';
      __addr[1].sa_data[4] = '\0';
      __addr[1].sa_data[5] = '\0';
      __addr[1].sa_data[6] = '\0';
      __addr[1].sa_data[7] = '\0';
      __addr[1].sa_data[8] = '\0';
      __addr[1].sa_data[9] = '\0';
      __addr[1].sa_data[10] = '\0';
      __addr[1].sa_data[0xb] = '\0';
      __addr[1].sa_data[0xc] = '\0';
      __addr[1].sa_data[0xd] = '\0';
      local_38 = pcVar1;
    }
    listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
    ::connect((listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
               *)this,__fd + 8,&local_48,__len);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The signal restrains connecting synchronous handlers!")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_async_only))
                WIGWAG_THROW("The signal restrains connecting synchronous handlers!");

            return listenable_base::connect(std::move(handler), attributes);
        }